

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *a_00;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint flag;
  secp256k1_gej *psVar12;
  secp256k1_gej *a_01;
  ulong uVar13;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar14;
  long lVar15;
  uint flag_00;
  secp256k1_gej *unaff_R14;
  secp256k1_gej *unaff_R15;
  bool bVar16;
  secp256k1_fe u1;
  secp256k1_fe s1;
  secp256k1_fe n;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe tt;
  secp256k1_fe zz;
  secp256k1_fe sStack_380;
  secp256k1_fe sStack_350;
  secp256k1_gej *psStack_320;
  secp256k1_gej *psStack_318;
  secp256k1_gej *psStack_310;
  secp256k1_gej *psStack_308;
  secp256k1_gej *psStack_300;
  uint64_t local_2f8;
  uint64_t uStack_2f0;
  secp256k1_gej *local_2e0;
  secp256k1_ge *local_2d8;
  secp256k1_fe *local_2d0;
  secp256k1_gej *local_2c8;
  secp256k1_gej *local_2c0;
  undefined1 local_2b8 [104];
  uint64_t uStack_250;
  uint64_t local_248;
  uint64_t uStack_240;
  uint64_t local_238;
  undefined8 local_230;
  undefined1 local_228 [72];
  uint64_t uStack_1e0;
  uint64_t local_1d8;
  uint64_t uStack_1d0;
  secp256k1_gej *local_1c8;
  ulong uStack_1c0;
  undefined1 local_1b8 [56];
  uint64_t uStack_180;
  uint64_t local_178;
  uint64_t uStack_170;
  secp256k1_gej *local_168;
  ulong uStack_160;
  undefined1 local_158 [56];
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t local_108;
  uint local_100;
  undefined1 local_f8 [56];
  uint64_t uStack_c0;
  uint64_t local_b8;
  uint64_t uStack_b0;
  uint64_t local_a8;
  ulong local_a0;
  secp256k1_fe local_98;
  secp256k1_fe local_60;
  
  psStack_300 = (secp256k1_gej *)0x10a3c9;
  psVar12 = a;
  secp256k1_gej_verify(a);
  psStack_300 = (secp256k1_gej *)0x10a3d1;
  a_01 = (secp256k1_gej *)b;
  secp256k1_ge_verify(b);
  if (b->infinity == 0) {
    psVar1 = &a->z;
    psStack_300 = (secp256k1_gej *)0x10a3f8;
    local_2c0 = r;
    secp256k1_fe_sqr(&local_60,psVar1);
    local_2b8._0_8_ = (a->x).n[0];
    local_2b8._8_8_ = (a->x).n[1];
    local_2b8._16_8_ = (a->x).n[2];
    local_2b8._24_8_ = (a->x).n[3];
    local_2b8._32_8_ = (a->x).n[4];
    local_2b8._40_4_ = (a->x).magnitude;
    local_2b8._44_4_ = (a->x).normalized;
    unaff_R14 = (secp256k1_gej *)(local_158 + 0x30);
    psStack_300 = (secp256k1_gej *)0x10a429;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R14,&b->x,&local_60);
    local_2b8._48_8_ = (a->y).n[0];
    local_2b8._56_8_ = (a->y).n[1];
    local_2b8._64_8_ = (a->y).n[2];
    local_2b8._72_8_ = (a->y).n[3];
    local_2b8._80_8_ = (a->y).n[4];
    local_2b8._88_4_ = (a->y).magnitude;
    local_2b8._92_4_ = (a->y).normalized;
    local_2d0 = &b->y;
    unaff_R12 = (secp256k1_gej *)local_158;
    psStack_300 = (secp256k1_gej *)0x10a466;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R12,local_2d0,&local_60);
    psStack_300 = (secp256k1_gej *)0x10a479;
    psVar12 = unaff_R12;
    local_2c8 = (secp256k1_gej *)psVar1;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R12,(secp256k1_fe *)unaff_R12,psVar1);
    unaff_R15 = (secp256k1_gej *)local_228;
    local_228._32_8_ = local_2b8._32_8_;
    local_228._40_8_ = local_2b8._40_8_;
    local_228._16_8_ = local_2b8._16_8_;
    local_228._24_8_ = local_2b8._24_8_;
    local_228._0_8_ = local_2b8._0_8_;
    local_228._8_8_ = local_2b8._8_8_;
    psStack_300 = (secp256k1_gej *)0x10a4a6;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    psStack_300 = (secp256k1_gej *)0x10a4ae;
    a_01 = unaff_R14;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    r = (secp256k1_gej *)psVar1;
    if (0x20 < (int)(local_100 + local_228._40_4_)) goto LAB_0010ace6;
    local_228._0_8_ = local_228._0_8_ + local_158._48_8_;
    local_228._8_8_ = local_228._8_8_ + uStack_120;
    local_228._16_8_ = local_228._16_8_ + local_118;
    local_228._24_8_ = local_228._24_8_ + uStack_110;
    local_228._32_8_ = local_228._32_8_ + local_108;
    local_228._44_4_ = 0;
    local_228._40_4_ = local_100 + local_228._40_4_;
    psStack_300 = (secp256k1_gej *)0x10a506;
    secp256k1_fe_verify((secp256k1_fe *)local_228);
    unaff_R14 = (secp256k1_gej *)(local_1b8 + 0x30);
    local_168 = (secp256k1_gej *)local_2b8._80_8_;
    uStack_160 = local_2b8._88_8_;
    local_178 = local_2b8._64_8_;
    uStack_170 = local_2b8._72_8_;
    local_1b8._48_8_ = local_2b8._48_8_;
    uStack_180 = local_2b8._56_8_;
    psStack_300 = (secp256k1_gej *)0x10a539;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    unaff_R15 = (secp256k1_gej *)local_158;
    psStack_300 = (secp256k1_gej *)0x10a549;
    a_01 = unaff_R15;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    if (0x20 < local_158._40_4_ + (int)uStack_160) goto LAB_0010aceb;
    local_228._48_8_ = local_1b8._48_8_ + local_158._0_8_;
    local_228._56_8_ = uStack_180 + local_158._8_8_;
    local_2f8 = local_178 + local_158._16_8_;
    uStack_2f0 = uStack_170 + local_158._24_8_;
    psVar14 = (secp256k1_gej *)((long)(local_168->x).n + local_158._32_8_);
    uStack_160 = (ulong)(uint)(local_158._40_4_ + (int)uStack_160);
    psStack_300 = (secp256k1_gej *)0x10a5b8;
    local_2d8 = b;
    local_1b8._48_8_ = local_228._48_8_;
    uStack_180 = local_228._56_8_;
    local_178 = local_2f8;
    uStack_170 = uStack_2f0;
    local_168 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)(local_1b8 + 0x30));
    unaff_R15 = (secp256k1_gej *)&local_98;
    psStack_300 = (secp256k1_gej *)0x10a5d0;
    secp256k1_fe_sqr((secp256k1_fe *)unaff_R15,(secp256k1_fe *)local_228);
    psStack_300 = (secp256k1_gej *)0x10a5e0;
    secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x30));
    psStack_300 = (secp256k1_gej *)0x10a5ee;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)local_100,1);
    local_f8._48_8_ = 0x3ffffbfffff0bc - local_158._48_8_;
    uStack_c0 = 0x3ffffffffffffc - uStack_120;
    unaff_R12 = (secp256k1_gej *)(local_f8 + 0x30);
    local_b8 = 0x3ffffffffffffc - local_118;
    uStack_b0 = 0x3ffffffffffffc - uStack_110;
    local_a8 = 0x3fffffffffffc - local_108;
    local_a0 = 2;
    psStack_300 = (secp256k1_gej *)0x10a642;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    unaff_R14 = (secp256k1_gej *)local_f8;
    psVar12 = (secp256k1_gej *)local_2b8;
    psStack_300 = (secp256k1_gej *)0x10a65a;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R14,(secp256k1_fe *)psVar12,(secp256k1_fe *)unaff_R12);
    psStack_300 = (secp256k1_gej *)0x10a662;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    psStack_300 = (secp256k1_gej *)0x10a66a;
    a_01 = unaff_R14;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    b = (secp256k1_ge *)psVar14;
    if (0x20 < local_f8._40_4_ + local_98.magnitude) goto LAB_0010acf0;
    unaff_R15 = (secp256k1_gej *)0xf000000000000;
    local_98.n[0] = local_98.n[0] + local_f8._0_8_;
    local_98.n[1] = local_98.n[1] + local_f8._8_8_;
    local_98.n[2] = local_98.n[2] + local_f8._16_8_;
    local_98.n[3] = local_98.n[3] + local_f8._24_8_;
    local_98.n[4] = local_98.n[4] + local_f8._32_8_;
    r = (secp256k1_gej *)0x1000003d0;
    local_98.normalized = 0;
    psStack_300 = (secp256k1_gej *)0x10a6ef;
    local_2e0 = a;
    local_98.magnitude = local_f8._40_4_ + local_98.magnitude;
    secp256k1_fe_verify(&local_98);
    psStack_300 = (secp256k1_gej *)0x10a6fc;
    secp256k1_fe_verify((secp256k1_fe *)(local_1b8 + 0x30));
    unaff_R12 = (secp256k1_gej *)0x1000003d1;
    lVar15 = ((ulong)psVar14 >> 0x30) * 0x1000003d1;
    uVar9 = local_228._48_8_ + lVar15;
    uVar8 = local_228._56_8_ + (uVar9 >> 0x34);
    uVar13 = local_2f8 + (uVar8 >> 0x34);
    uVar10 = uStack_2f0 + (uVar13 >> 0x34);
    uVar11 = (uVar10 >> 0x34) + ((ulong)psVar14 & 0xffffffffffff);
    psVar12 = (secp256k1_gej *)
              ((uVar9 ^ 0x1000003d0) & uVar8 & uVar13 & uVar10 & (uVar11 ^ 0xf000000000000));
    bVar16 = psVar12 == (secp256k1_gej *)0xfffffffffffff;
    b = (secp256k1_ge *)CONCAT71((int7)((ulong)lVar15 >> 8),bVar16);
    unaff_R14 = (secp256k1_gej *)(local_228 + 0x40);
    local_1c8 = (secp256k1_gej *)local_2b8._80_8_;
    uStack_1c0 = local_2b8._88_8_;
    local_1d8 = local_2b8._64_8_;
    uStack_1d0 = local_2b8._72_8_;
    local_228._64_8_ = local_2b8._48_8_;
    uStack_1e0 = local_2b8._56_8_;
    psStack_300 = (secp256k1_gej *)0x10a7c4;
    a_01 = unaff_R14;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    if (0x10 < (int)uStack_1c0) goto LAB_0010acf5;
    local_228._64_8_ = local_228._64_8_ * 2;
    uStack_1e0 = uStack_1e0 * 2;
    local_1d8 = local_1d8 * 2;
    uStack_1d0 = uStack_1d0 * 2;
    local_1c8 = (secp256k1_gej *)((long)local_1c8 << 1);
    uStack_1c0 = (ulong)(uint)((int)uStack_1c0 * 2);
    psStack_300 = (secp256k1_gej *)0x10a808;
    secp256k1_fe_verify((secp256k1_fe *)(local_228 + 0x40));
    unaff_R14 = (secp256k1_gej *)(local_f8 + 0x30);
    psStack_300 = (secp256k1_gej *)0x10a818;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    unaff_R15 = (secp256k1_gej *)local_2b8;
    psStack_300 = (secp256k1_gej *)0x10a825;
    a_01 = unaff_R15;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    if (0x20 < local_2b8._40_4_ + (int)local_a0) goto LAB_0010acfa;
    local_2f8 = 0x1000003d1;
    unaff_R12 = (secp256k1_gej *)(local_f8 + 0x30);
    local_f8._48_8_ = local_f8._48_8_ + local_2b8._0_8_;
    uStack_c0 = uStack_c0 + local_2b8._8_8_;
    local_b8 = local_b8 + local_2b8._16_8_;
    uStack_b0 = uStack_b0 + local_2b8._24_8_;
    local_a8 = local_a8 + local_2b8._32_8_;
    local_a0 = (ulong)(uint)(local_2b8._40_4_ + (int)local_a0);
    psStack_300 = (secp256k1_gej *)0x10a88f;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    flag = (uint)(((uVar8 | uVar9 | uVar13 | uVar10) & 0xfffffffffffff) == 0 && uVar11 == 0 ||
                 bVar16);
    flag_00 = flag ^ 1;
    psStack_300 = (secp256k1_gej *)0x10a8ae;
    secp256k1_fe_cmov((secp256k1_fe *)(local_228 + 0x40),&local_98,flag_00);
    psStack_300 = (secp256k1_gej *)0x10a8c1;
    secp256k1_fe_cmov((secp256k1_fe *)unaff_R12,(secp256k1_fe *)(local_1b8 + 0x30),flag_00);
    psStack_300 = (secp256k1_gej *)0x10a8d4;
    secp256k1_fe_sqr((secp256k1_fe *)local_1b8,(secp256k1_fe *)unaff_R12);
    unaff_R15 = (secp256k1_gej *)local_228;
    psStack_300 = (secp256k1_gej *)0x10a8e4;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    psStack_300 = (secp256k1_gej *)0x10a8f2;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_228._40_8_ & 0xffffffff),5);
    local_2b8._96_8_ = 0xbffff3ffffd234 - local_228._0_8_;
    uStack_250 = 0xbffffffffffff4 - local_228._8_8_;
    unaff_R14 = (secp256k1_gej *)(local_2b8 + 0x60);
    local_248 = 0xbffffffffffff4 - local_228._16_8_;
    uStack_240 = 0xbffffffffffff4 - local_228._24_8_;
    local_238 = 0xbfffffffffff4 - local_228._32_8_;
    local_230._0_4_ = 6;
    local_230._4_4_ = 0;
    psStack_300 = (secp256k1_gej *)0x10a942;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    psStack_300 = (secp256k1_gej *)0x10a950;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R14,(secp256k1_fe *)unaff_R14,(secp256k1_fe *)local_1b8);
    psStack_300 = (secp256k1_gej *)0x10a95b;
    secp256k1_fe_sqr((secp256k1_fe *)local_1b8,(secp256k1_fe *)local_1b8);
    psStack_300 = (secp256k1_gej *)0x10a96d;
    secp256k1_fe_cmov((secp256k1_fe *)local_1b8,(secp256k1_fe *)(local_1b8 + 0x30),flag);
    psStack_300 = (secp256k1_gej *)0x10a97d;
    secp256k1_fe_sqr((secp256k1_fe *)unaff_R15,(secp256k1_fe *)(local_228 + 0x40));
    b = (secp256k1_ge *)local_2c0;
    psVar1 = &local_2c0->z;
    psStack_300 = (secp256k1_gej *)0x10a996;
    psVar12 = local_2c8;
    secp256k1_fe_mul(psVar1,&local_2c8->x,(secp256k1_fe *)unaff_R12);
    psStack_300 = (secp256k1_gej *)0x10a99e;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    psStack_300 = (secp256k1_gej *)0x10a9a6;
    a_01 = unaff_R14;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    if (0x20 < (int)local_230 + local_228._40_4_) goto LAB_0010acff;
    unaff_R14 = (secp256k1_gej *)local_228;
    local_228._0_8_ = local_228._0_8_ + local_2b8._96_8_;
    local_228._8_8_ = local_228._8_8_ + uStack_250;
    local_228._16_8_ = local_228._16_8_ + local_248;
    local_228._24_8_ = local_228._24_8_ + uStack_240;
    local_228._32_8_ = local_228._32_8_ + local_238;
    local_228._44_4_ = 0;
    local_228._40_4_ = (int)local_230 + local_228._40_4_;
    psStack_300 = (secp256k1_gej *)0x10aa07;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    (((secp256k1_gej *)b)->x).n[4] = local_228._32_8_;
    (((secp256k1_gej *)b)->x).magnitude = local_228._40_4_;
    (((secp256k1_gej *)b)->x).normalized = local_228._44_4_;
    (((secp256k1_gej *)b)->x).n[2] = local_228._16_8_;
    (((secp256k1_gej *)b)->x).n[3] = local_228._24_8_;
    (((secp256k1_gej *)b)->x).n[0] = local_228._0_8_;
    (((secp256k1_gej *)b)->x).n[1] = local_228._8_8_;
    psStack_300 = (secp256k1_gej *)0x10aa2c;
    a_01 = unaff_R14;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    if (0x10 < (int)local_228._40_4_) goto LAB_0010ad04;
    unaff_R14 = (secp256k1_gej *)local_228;
    local_228._0_8_ = local_228._0_8_ * 2;
    local_228._8_8_ = local_228._8_8_ * 2;
    local_228._16_8_ = local_228._16_8_ * 2;
    local_228._24_8_ = local_228._24_8_ * 2;
    local_228._32_8_ = local_228._32_8_ << 1;
    local_228._44_4_ = 0;
    local_228._40_4_ = local_228._40_4_ * 2;
    psStack_300 = (secp256k1_gej *)0x10aa79;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    psStack_300 = (secp256k1_gej *)0x10aa81;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    unaff_R15 = (secp256k1_gej *)(local_2b8 + 0x60);
    psStack_300 = (secp256k1_gej *)0x10aa91;
    a_01 = unaff_R15;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    if ((int)local_230 + local_228._40_4_ < 0x21) {
      unaff_R14 = (secp256k1_gej *)local_228;
      local_228._0_8_ = local_228._0_8_ + local_2b8._96_8_;
      local_228._8_8_ = local_228._8_8_ + uStack_250;
      local_228._16_8_ = local_228._16_8_ + local_248;
      local_228._24_8_ = local_228._24_8_ + uStack_240;
      local_228._32_8_ = local_228._32_8_ + local_238;
      local_228._44_4_ = 0;
      local_228._40_4_ = (int)local_230 + local_228._40_4_;
      psStack_300 = (secp256k1_gej *)0x10aaf2;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
      psStack_300 = (secp256k1_gej *)0x10ab05;
      psVar12 = unaff_R14;
      secp256k1_fe_mul((secp256k1_fe *)unaff_R14,(secp256k1_fe *)unaff_R14,
                       (secp256k1_fe *)(local_228 + 0x40));
      psStack_300 = (secp256k1_gej *)0x10ab0d;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
      unaff_R15 = (secp256k1_gej *)local_1b8;
      psStack_300 = (secp256k1_gej *)0x10ab1d;
      a_01 = unaff_R15;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
      if ((int)(local_1b8._40_4_ + local_228._40_4_) < 0x21) {
        local_228._0_8_ = local_228._0_8_ + local_1b8._0_8_;
        local_228._8_8_ = local_228._8_8_ + local_1b8._8_8_;
        local_228._16_8_ = local_228._16_8_ + local_1b8._16_8_;
        local_228._24_8_ = local_228._24_8_ + local_1b8._24_8_;
        local_228._32_8_ = local_228._32_8_ + local_1b8._32_8_;
        local_228._44_4_ = 0;
        local_228._40_4_ = local_1b8._40_4_ + local_228._40_4_;
        psStack_300 = (secp256k1_gej *)0x10ab7e;
        secp256k1_fe_verify((secp256k1_fe *)local_228);
        a_00 = &((secp256k1_gej *)b)->y;
        psStack_300 = (secp256k1_gej *)0x10ab8a;
        secp256k1_fe_verify((secp256k1_fe *)local_228);
        psStack_300 = (secp256k1_gej *)0x10ab98;
        secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_228._40_8_ & 0xffffffff),6);
        (((secp256k1_gej *)b)->y).n[0] = 0xdffff1ffffca92 - local_228._0_8_;
        (((secp256k1_gej *)b)->y).n[1] = 0xdffffffffffff2 - local_228._8_8_;
        (((secp256k1_gej *)b)->y).n[2] = 0xdffffffffffff2 - local_228._16_8_;
        (((secp256k1_gej *)b)->y).n[3] = 0xdffffffffffff2 - local_228._24_8_;
        (((secp256k1_gej *)b)->y).n[4] = 0xdfffffffffff2 - local_228._32_8_;
        (((secp256k1_gej *)b)->y).magnitude = 7;
        (((secp256k1_gej *)b)->y).normalized = 0;
        psStack_300 = (secp256k1_gej *)0x10abe1;
        secp256k1_fe_verify(a_00);
        psStack_300 = (secp256k1_gej *)0x10abe9;
        secp256k1_fe_half(a_00);
        psVar12 = local_2e0;
        psStack_300 = (secp256k1_gej *)0x10ac02;
        secp256k1_fe_cmov(&b->x,&local_2d8->x,local_2e0->infinity);
        psStack_300 = (secp256k1_gej *)0x10ac16;
        secp256k1_fe_cmov(a_00,local_2d0,psVar12->infinity);
        psStack_300 = (secp256k1_gej *)0x10ac2c;
        secp256k1_fe_cmov(psVar1,&secp256k1_fe_one,psVar12->infinity);
        psStack_300 = (secp256k1_gej *)0x10ac34;
        secp256k1_fe_verify(psVar1);
        uVar8 = (((secp256k1_gej *)b)->z).n[4];
        uVar10 = (uVar8 >> 0x30) * local_2f8 + (((secp256k1_gej *)b)->z).n[0];
        uVar9 = (uVar10 >> 0x34) + (((secp256k1_gej *)b)->z).n[1];
        uVar11 = (uVar9 >> 0x34) + (((secp256k1_gej *)b)->z).n[2];
        uVar13 = (uVar11 >> 0x34) + (((secp256k1_gej *)b)->z).n[3];
        uVar8 = (uVar13 >> 0x34) + (uVar8 & 0xffffffffffff);
        ((secp256k1_gej *)b)->infinity =
             (uint)(((uVar10 ^ 0x1000003d0) & uVar9 & uVar11 & uVar13 & (uVar8 ^ 0xf000000000000))
                    == 0xfffffffffffff ||
                   ((uVar9 | uVar10 | uVar11 | uVar13) & 0xfffffffffffff) == 0 && uVar8 == 0);
        psStack_300 = (secp256k1_gej *)0x10accf;
        secp256k1_gej_verify((secp256k1_gej *)b);
        return;
      }
      goto LAB_0010ad0e;
    }
  }
  else {
    psStack_300 = (secp256k1_gej *)0x10ace6;
    secp256k1_gej_add_ge_cold_1();
LAB_0010ace6:
    psStack_300 = (secp256k1_gej *)0x10aceb;
    secp256k1_gej_add_ge_cold_10();
LAB_0010aceb:
    psStack_300 = (secp256k1_gej *)0x10acf0;
    secp256k1_gej_add_ge_cold_9();
LAB_0010acf0:
    psStack_300 = (secp256k1_gej *)0x10acf5;
    secp256k1_gej_add_ge_cold_8();
LAB_0010acf5:
    psStack_300 = (secp256k1_gej *)0x10acfa;
    secp256k1_gej_add_ge_cold_7();
LAB_0010acfa:
    psStack_300 = (secp256k1_gej *)0x10acff;
    secp256k1_gej_add_ge_cold_6();
LAB_0010acff:
    psStack_300 = (secp256k1_gej *)0x10ad04;
    secp256k1_gej_add_ge_cold_5();
LAB_0010ad04:
    psStack_300 = (secp256k1_gej *)0x10ad09;
    secp256k1_gej_add_ge_cold_4();
  }
  psStack_300 = (secp256k1_gej *)0x10ad0e;
  secp256k1_gej_add_ge_cold_3();
LAB_0010ad0e:
  psStack_300 = (secp256k1_gej *)secp256k1_ge_set_gej;
  secp256k1_gej_add_ge_cold_2();
  psStack_320 = r;
  psStack_318 = unaff_R12;
  psStack_310 = (secp256k1_gej *)b;
  psStack_308 = unaff_R14;
  psStack_300 = unaff_R15;
  secp256k1_gej_verify(psVar12);
  *(int *)(a_01->z).n = psVar12->infinity;
  psVar1 = &psVar12->z;
  secp256k1_fe_inv(psVar1,psVar1);
  secp256k1_fe_sqr(&sStack_350,psVar1);
  secp256k1_fe_mul(&sStack_380,psVar1,&sStack_350);
  secp256k1_fe_mul(&psVar12->x,&psVar12->x,&sStack_350);
  secp256k1_fe_mul(&psVar12->y,&psVar12->y,&sStack_380);
  (psVar12->z).n[0] = 1;
  (psVar12->z).n[1] = 0;
  (psVar12->z).n[2] = 0;
  (psVar12->z).n[3] = 0;
  (psVar12->z).n[4] = 0;
  (psVar12->z).magnitude = 1;
  (psVar12->z).normalized = 1;
  secp256k1_fe_verify(psVar1);
  uVar2 = (psVar12->x).n[0];
  uVar3 = (psVar12->x).n[1];
  uVar4 = (psVar12->x).n[2];
  uVar5 = (psVar12->x).n[3];
  iVar6 = (psVar12->x).magnitude;
  iVar7 = (psVar12->x).normalized;
  (a_01->x).n[4] = (psVar12->x).n[4];
  (a_01->x).magnitude = iVar6;
  (a_01->x).normalized = iVar7;
  (a_01->x).n[2] = uVar4;
  (a_01->x).n[3] = uVar5;
  (a_01->x).n[0] = uVar2;
  (a_01->x).n[1] = uVar3;
  uVar2 = (psVar12->y).n[1];
  uVar3 = (psVar12->y).n[2];
  uVar4 = (psVar12->y).n[3];
  uVar5 = (psVar12->y).n[4];
  iVar6 = (psVar12->y).magnitude;
  iVar7 = (psVar12->y).normalized;
  (a_01->y).n[0] = (psVar12->y).n[0];
  (a_01->y).n[1] = uVar2;
  (a_01->y).n[2] = uVar3;
  (a_01->y).n[3] = uVar4;
  (a_01->y).n[4] = uVar5;
  (a_01->y).magnitude = iVar6;
  (a_01->y).normalized = iVar7;
  secp256k1_gej_verify(psVar12);
  secp256k1_ge_verify((secp256k1_ge *)a_01);
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 21 add/cmov/half/mul_int/negate/normalizes_to_zero */
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int degenerate;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    VERIFY_CHECK(!b->infinity);

    /*  In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = -T*M^2
     *    R = T^2-U1*U2
     *    X3 = R^2+Q
     *    Y3 = -(R*(2*X3+Q)+M^4)/2
     *    Z3 = M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x;                                          /* u1 = U1 = X1*Z2^2 (GEJ_X_M) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y;                                          /* s1 = S1 = Y1*Z2^3 (GEJ_Y_M) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (GEJ_X_M+1) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 (2) */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (1) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (2) */
    /* If lambda = R/M = R/0 we have a problem (except in the "trivial"
     * case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr_alt = Y1*Z2^3 - Y2*Z1^3 (GEJ_Y_M*2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 (GEJ_X_M+2) */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);       /* rr_alt (GEJ_Y_M*2) */
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);         /* m_alt (GEJ_X_M+2) */
    /* Now Ralt / Malt = lambda and is guaranteed not to be Ralt / 0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_negate(&q, &t,
        SECP256K1_GEJ_X_MAGNITUDE_MAX + 1);             /* q = -T (GEJ_X_M+2) */
    secp256k1_fe_mul(&q, &q, &n);                       /* q = Q = -T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);                           /* n = Malt^4 (1) */
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Z3 = Malt*Z (1) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2 + Q (2) */
    r->x = t;                                           /* r->x = X3 = Ralt^2 + Q (2) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*X3 (4) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*X3 + Q (5) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*X3 + Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*X3 + Q) + M^3*Malt (GEJ_Y_M+2) */
    secp256k1_fe_negate(&r->y, &t,
        SECP256K1_GEJ_Y_MAGNITUDE_MAX + 2);             /* r->y = -(Ralt*(2*X3 + Q) + M^3*Malt) (GEJ_Y_M+3) */
    secp256k1_fe_half(&r->y);                           /* r->y = Y3 = -(Ralt*(2*X3 + Q) + M^3*Malt)/2 ((GEJ_Y_M+3)/2 + 1) */

    /* In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &secp256k1_fe_one, a->infinity);

    /* Set r->infinity if r->z is 0.
     *
     * If a->infinity is set, then r->infinity = (r->z == 0) = (1 == 0) = false,
     * which is correct because the function assumes that b is not infinity.
     *
     * Now assume !a->infinity. This implies Z = Z1 != 0.
     *
     * Case y1 = -y2:
     * In this case we could have a = -b, namely if x1 = x2.
     * We have degenerate = true, r->z = (x1 - x2) * Z.
     * Then r->infinity = ((x1 - x2)Z == 0) = (x1 == x2) = (a == -b).
     *
     * Case y1 != -y2:
     * In this case, we can't have a = -b.
     * We have degenerate = false, r->z = (y1 + y2) * Z.
     * Then r->infinity = ((y1 + y2)Z == 0) = (y1 == -y2) = false. */
    r->infinity = secp256k1_fe_normalizes_to_zero(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}